

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void copy_example_to_adf(warm_cb *data,example *ec)

{
  bool bVar1;
  uint32_t uVar2;
  reference ppeVar3;
  features *pfVar4;
  unsigned_long **ppuVar5;
  ulong uVar6;
  long in_RDI;
  feature_index *idx;
  unsigned_long *__end3;
  unsigned_long *__begin3;
  v_array<unsigned_long> *__range3;
  features *fs;
  iterator __end2;
  iterator __begin2;
  example *__range2;
  label *lab;
  example *eca;
  size_t a;
  uint64_t mask;
  uint64_t ss;
  parameters *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  example *in_stack_ffffffffffffff80;
  example *in_stack_ffffffffffffff88;
  v_array<unsigned_long> *in_stack_ffffffffffffff90;
  iterator local_60;
  iterator local_50;
  value_type local_40;
  polylabel *local_38;
  value_type local_30;
  ulong local_28;
  uint64_t local_20;
  ulong local_18;
  long local_8;
  
  local_8 = in_RDI;
  uVar2 = parameters::stride_shift(in_stack_ffffffffffffff68);
  local_18 = (ulong)uVar2;
  local_20 = parameters::mask(in_stack_ffffffffffffff68);
  for (local_28 = 0; local_28 < *(uint *)(local_8 + 0xa8); local_28 = local_28 + 1) {
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(local_8 + 0x58),local_28)
    ;
    local_30 = *ppeVar3;
    local_38 = &local_30->l;
    (*(code *)CB::cb_label)(local_38);
    VW::copy_example_data
              (SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0),in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    local_40 = local_30;
    local_50 = example_predict::begin
                         ((example_predict *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    local_60 = example_predict::end
                         ((example_predict *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    while (bVar1 = example_predict::iterator::operator!=(&local_50,&local_60), bVar1) {
      pfVar4 = example_predict::iterator::operator*(&local_50);
      in_stack_ffffffffffffff90 = &pfVar4->indicies;
      ppuVar5 = v_array<unsigned_long>::begin(in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff88 = (example *)*ppuVar5;
      ppuVar5 = v_array<unsigned_long>::end(in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff80 = (example *)*ppuVar5;
      for (; in_stack_ffffffffffffff88 != in_stack_ffffffffffffff80;
          in_stack_ffffffffffffff88 =
               (example *)&(in_stack_ffffffffffffff88->super_example_predict).indices._end) {
        (in_stack_ffffffffffffff88->super_example_predict).indices._begin =
             (uchar *)(((ulong)(in_stack_ffffffffffffff88->super_example_predict).indices._begin >>
                       ((byte)local_18 & 0x3f)) * 0x1b90d09 + local_28 * 0x49be95 <<
                       ((byte)local_18 & 0x3f) & local_20);
      }
      example_predict::iterator::operator++(&local_50);
    }
    bVar1 = CB_ALGS::example_is_newline_not_header
                      ((example *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    if ((bVar1) && (uVar6 = (*(code *)PTR_test_label_0048cd20)(&local_30->l), (uVar6 & 1) != 0)) {
      in_stack_ffffffffffffff77 = 0x6e;
      v_array<char>::push_back
                ((v_array<char> *)CONCAT17(0x6e,in_stack_ffffffffffffff70),
                 &in_stack_ffffffffffffff68->sparse);
    }
  }
  return;
}

Assistant:

void copy_example_to_adf(warm_cb& data, example& ec)
{
  const uint64_t ss = data.all->weights.stride_shift();
  const uint64_t mask = data.all->weights.mask();

  for (size_t a = 0; a < data.num_actions; ++a)
  {
    auto& eca = *data.ecs[a];
    // clear label
    auto& lab = eca.l.cb;
    CB::cb_label.default_label(&lab);

    // copy data
    VW::copy_example_data(false, &eca, &ec);

    // offset indicies for given action
    for (features& fs : eca)
    {
      for (feature_index& idx : fs.indicies)
      {
        idx = ((((idx >> ss) * 28904713) + 4832917 * (uint64_t)a) << ss) & mask;
      }
    }

    // avoid empty example by adding a tag (hacky)
    if (CB_ALGS::example_is_newline_not_header(eca) && CB::cb_label.test_label(&eca.l))
    {
      eca.tag.push_back('n');
    }
  }
}